

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

uint __thiscall
Assimp::PretransformVertices::GetMeshVFormat(PretransformVertices *this,aiMesh *pcMesh)

{
  uint uVar1;
  
  if (pcMesh->mBones != (aiBone **)0x0) {
    return (uint)pcMesh->mBones;
  }
  uVar1 = GetMeshVFormatUnique(pcMesh);
  pcMesh->mBones = (aiBone **)(ulong)uVar1;
  return uVar1;
}

Assistant:

unsigned int PretransformVertices::GetMeshVFormat( aiMesh* pcMesh )
{
    // the vertex format is stored in aiMesh::mBones for later retrieval.
    // there isn't a good reason to compute it a few hundred times
    // from scratch. The pointer is unused as animations are lost
    // during PretransformVertices.
    if (pcMesh->mBones)
        return (unsigned int)(uint64_t)pcMesh->mBones;


    const unsigned int iRet = GetMeshVFormatUnique(pcMesh);

    // store the value for later use
    pcMesh->mBones = (aiBone**)(uint64_t)iRet;
    return iRet;
}